

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetExtensionAllowed(JsValueRef object,bool *value)

{
  anon_class_16_2_7066559d fn;
  JsErrorCode JVar1;
  bool *local_18;
  bool *value_local;
  JsValueRef object_local;
  
  fn.value = &local_18;
  fn.object = &value_local;
  local_18 = value;
  value_local = (bool *)object;
  JVar1 = ContextAPIWrapper<false,JsGetExtensionAllowed::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetExtensionAllowed(_In_ JsValueRef object, _Out_ bool *value)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        PARAM_NOT_NULL(value);
        *value = false;

        *value = Js::VarTo<Js::RecyclableObject>(object)->IsExtensible() != 0;

        return JsNoError;
    });
}